

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::OneofDescriptorProto::InternalSerializeWithCachedSizesToArray
          (OneofDescriptorProto *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  int size;
  char *data;
  string *value;
  UnknownFieldSet *unknown_fields;
  uint8 *puStack_40;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  OneofDescriptorProto *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  puStack_40 = target;
  if ((uVar1 & 1) != 0) {
    name_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (data,size,SERIALIZE,"google.protobuf.OneofDescriptorProto.name");
    value = name_abi_cxx11_(this);
    puStack_40 = internal::WireFormatLite::WriteStringToArray(1,value,target);
  }
  if ((uVar1 & 2) != 0) {
    puStack_40 = internal::WireFormatLite::
                 InternalWriteMessageNoVirtualToArray<google::protobuf::OneofOptions>
                           (2,this->options_,deterministic,puStack_40);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = OneofDescriptorProto::unknown_fields(this);
    puStack_40 = internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,puStack_40);
  }
  return puStack_40;
}

Assistant:

::google::protobuf::uint8* OneofDescriptorProto::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.OneofDescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.OneofDescriptorProto.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional .google.protobuf.OneofOptions options = 2;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        2, *this->options_, deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.OneofDescriptorProto)
  return target;
}